

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfm.cpp
# Opt level: O0

Ref<embree::Image> embree::loadPFM(FileName *fileName)

{
  undefined8 uVar1;
  bool bVar2;
  char *pcVar3;
  runtime_error *prVar4;
  _func_int **pp_Var5;
  size_t width_00;
  ImageT<embree::Col4<float>_> *this;
  Image *in_RDI;
  ssize_t x;
  ssize_t y;
  float rgb [3];
  float rcpMaxColor;
  float maxColor;
  int height;
  int width;
  string type;
  char cty [2];
  fstream file;
  Ref<embree::Image> *img;
  FileName *in_stack_fffffffffffffc38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc40;
  undefined7 in_stack_fffffffffffffc70;
  undefined1 in_stack_fffffffffffffc77;
  size_t in_stack_fffffffffffffc78;
  float local_328;
  float fStack_324;
  float fStack_320;
  undefined4 uStack_31c;
  long local_310;
  long local_308;
  float local_300;
  float local_2fc;
  float local_2f8;
  undefined1 local_2f1;
  string local_2f0 [35];
  undefined1 local_2cd;
  float local_2cc;
  float local_2c8;
  int local_2c4;
  int local_2c0;
  allocator local_2b9;
  string local_2b8 [34];
  char local_296 [14];
  long local_288 [68];
  _func_int **local_68;
  undefined4 local_50;
  float local_4c;
  float local_48;
  float local_44;
  float *local_40;
  undefined8 local_28;
  undefined8 uStack_20;
  float local_10;
  float local_c;
  float local_8;
  undefined4 local_4;
  
  std::fstream::fstream(local_288);
  uVar1 = *(undefined8 *)(local_288[0] + -0x18);
  std::operator|(_S_failbit,_S_badbit);
  std::ios::exceptions((int)local_288 + (int)uVar1);
  pcVar3 = FileName::c_str((FileName *)0x420f3e);
  std::operator|(_S_in,_S_bin);
  std::fstream::open((char *)local_288,(_Ios_Openmode)pcVar3);
  std::istream::read((char *)local_288,(long)local_296);
  skipSpacesAndComments((fstream *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2b8,local_296,2,&local_2b9);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
  std::istream::operator>>(local_288,&local_2c0);
  skipSpacesAndComments((fstream *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70));
  std::istream::operator>>(local_288,&local_2c4);
  skipSpacesAndComments((fstream *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70));
  std::istream::operator>>(local_288,&local_2c8);
  if (0.0 < local_2c8) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"Big endian PFM files not supported");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_2cc = -1.0 / local_2c8;
  std::istream::ignore();
  local_2cd = 0;
  pp_Var5 = (_func_int **)::operator_new(0x48);
  local_2f1 = 1;
  width_00 = (size_t)local_2c0;
  this = (ImageT<embree::Col4<float>_> *)(long)local_2c4;
  FileName::operator_cast_to_string(in_stack_fffffffffffffc38);
  ImageT<embree::Col4<float>_>::ImageT
            (this,width_00,in_stack_fffffffffffffc78,
             (string *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70));
  local_2f1 = 0;
  (in_RDI->super_RefCount)._vptr_RefCount = pp_Var5;
  local_68 = pp_Var5;
  if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
    (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
  }
  std::__cxx11::string::~string(local_2f0);
  bVar2 = std::operator==(in_stack_fffffffffffffc40,(char *)in_stack_fffffffffffffc38);
  if (bVar2) {
    for (local_308 = (long)(local_2c4 + -1); -1 < local_308; local_308 = local_308 + -1) {
      for (local_310 = 0; local_310 < local_2c0; local_310 = local_310 + 1) {
        std::istream::read((char *)local_288,(long)&local_300);
        pp_Var5 = (in_RDI->super_RefCount)._vptr_RefCount;
        local_44 = local_300 * local_2cc;
        local_48 = local_2fc * local_2cc;
        local_4c = local_2f8 * local_2cc;
        local_40 = &local_328;
        local_50 = 0x3f800000;
        local_4 = 0x3f800000;
        local_28 = CONCAT44(local_48,local_44);
        uStack_20 = CONCAT44(0x3f800000,local_4c);
        uStack_31c = 0x3f800000;
        local_10 = local_44;
        local_c = local_48;
        local_8 = local_4c;
        local_328 = local_44;
        fStack_324 = local_48;
        fStack_320 = local_4c;
        (**(code **)(*pp_Var5 + 0x28))(pp_Var5,local_310,local_308,&local_328);
      }
    }
    local_2cd = 1;
    std::__cxx11::string::~string(local_2b8);
    std::fstream::~fstream(local_288);
    return (Ref<embree::Image>)in_RDI;
  }
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar4,"Invalid magic value in PFM file");
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Ref<Image> loadPFM(const FileName& fileName)
  {
    /* open file for reading */
    std::fstream file;
    file.exceptions (std::fstream::failbit | std::fstream::badbit);
    file.open (fileName.c_str(), std::fstream::in | std::fstream::binary);

    /* read file type */
    char cty[2]; file.read(cty,2);
    skipSpacesAndComments(file);
    std::string type(cty,2);

    /* read width, height, and maximum color value */
    int width; file >> width;
    skipSpacesAndComments(file);
    int height; file >> height;
    skipSpacesAndComments(file);
    float maxColor; file >> maxColor;
    if (maxColor > 0) THROW_RUNTIME_ERROR("Big endian PFM files not supported");
    float rcpMaxColor = -1.0f/float(maxColor);
    file.ignore(); // skip space or return

    /* create image and fill with data */
    Ref<Image> img = new Image4f(width,height,fileName);

    /* image in binary format 16 bit */
    if (type == "PF")
    {
      float rgb[3];
      for (ssize_t y=height-1; y>=0; y--) {
        for (ssize_t x=0; x<width; x++) {
          file.read((char*)rgb,sizeof(rgb));
          img->set(x,y,Color4(rgb[0]*rcpMaxColor,rgb[1]*rcpMaxColor,rgb[2]*rcpMaxColor,1.0f));
        }
      }
    }

    /* invalid magic value */
    else {
      THROW_RUNTIME_ERROR("Invalid magic value in PFM file");
    }
    return img;
  }